

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.cpp
# Opt level: O3

void * NortekDVLThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  SOCKET SVar9;
  double dVar10;
  undefined1 auVar11 [16];
  CHRONO chrono_period;
  NORTEKDVL nortekdvl;
  char szTemp [256];
  NMEADATA nmeadata;
  char szSaveFilePath [256];
  double local_c30;
  double local_c28;
  interval local_c20;
  int local_c08;
  int local_c04;
  interval local_c00;
  interval local_be8;
  double local_bd0;
  timespec local_bc8;
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [16];
  timespec local_b98;
  int local_b88;
  NORTEKDVL local_b80;
  char local_618 [264];
  NMEADATA local_510;
  char local_138 [264];
  
  memset(&local_b80,0,0x568);
  memset(&local_510,0,0x3d8);
  iVar5 = clock_getres(4,&local_b98);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_bc8), iVar5 == 0)) {
    local_b88 = 0;
    local_bb8 = (undefined1  [16])0x0;
    local_ba8 = (undefined1  [16])0x0;
  }
  local_c08 = 100;
  bVar2 = false;
  local_c04 = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      if (local_b88 == 0) {
        clock_gettime(4,(timespec *)&local_c20);
        local_bb8._8_8_ = local_c20.sup;
        local_bb8._0_8_ = local_c20.inf;
        local_c20.inf =
             (double)((((long)local_c20.inf + local_ba8._0_8_) - local_bc8.tv_sec) +
                     ((long)local_c20.sup + local_ba8._8_8_) / 1000000000);
        local_c20.sup =
             (double)(((long)local_c20.sup + local_ba8._8_8_) % 1000000000 - local_bc8.tv_nsec);
        if ((long)local_c20.sup < 0) {
          local_c20.inf =
               (double)((long)local_c20.inf + ~((ulong)-(long)local_c20.sup / 1000000000));
          local_c20.sup =
               (double)((long)local_c20.sup + 1000000000 +
                       ((ulong)-(long)local_c20.sup / 1000000000) * 1000000000);
        }
        local_ba8._8_8_ = local_c20.sup;
        local_ba8._0_8_ = local_c20.inf;
      }
      iVar5 = clock_getres(4,&local_b98);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_bc8), iVar5 == 0)) {
        local_b88 = 0;
        local_ba8 = (undefined1  [16])0x0;
        local_bb8 = (undefined1  [16])0x0;
      }
      if (bPauseNortekDVL == 0) break;
      if (!bVar2) {
        puts("NortekDVL paused.");
        SVar9 = local_b80.RS232Port.s;
        switch(local_b80.RS232Port.DevType) {
        case 0:
          SVar9 = (int)local_b80.RS232Port.hDev;
          goto LAB_001b4d5a;
        case 1:
        case 3:
          break;
        case 2:
          shutdown(local_b80.RS232Port.s,2);
          close(SVar9);
        case 4:
          SVar9 = local_b80.RS232Port.s_srv;
          break;
        default:
          goto switchD_001b4d1c_default;
        }
        shutdown(SVar9,2);
LAB_001b4d5a:
        iVar5 = close(SVar9);
        pcVar8 = "NortekDVL disconnected.";
        if (iVar5 != 0) {
switchD_001b4d1c_default:
          pcVar8 = "NortekDVL disconnection failed.";
        }
        puts(pcVar8);
      }
      if (bExit != 0) goto LAB_001b560a;
      local_c20.inf = 0.0;
      local_c20.sup = 4.94065645841247e-316;
      nanosleep((timespec *)&local_c20,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartNortekDVL == 0) {
      if (bVar2) goto LAB_001b5083;
      iVar5 = GetNMEASentenceNortekDVL(&local_b80,&local_510);
      if (iVar5 == 0) {
        iVar5 = pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        auVar11._0_4_ = -(uint)(local_b80.bEnable_PD6_SA == 0);
        auVar11._4_4_ = -(uint)(local_b80.bEnable_PD6_TS == 0);
        auVar11._8_4_ = -(uint)(local_b80.bEnable_PD6_BI == 0);
        auVar11._12_4_ = -(uint)(local_b80.bEnable_PD6_BS == 0);
        iVar5 = movmskps(iVar5,auVar11);
        if (((iVar5 != 0xf) || (local_b80.bEnable_PD6_BE != 0)) || (local_b80.bEnable_PD6_BD != 0))
        {
          if ((~auVar11._0_4_ & 1) != 0) {
            dVar10 = fmod((1.5707963267948966 - local_510.Heading) - angle_env,6.283185307179586);
            local_c30 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
            local_c30 = local_c30 + -3.141592653589793;
            interval::interval(&local_c00,&local_c30);
            local_c28 = -psi_ahrs_acc;
            interval::interval(&local_be8,&local_c28,&psi_ahrs_acc);
            operator+(&local_c00,&local_be8);
            interval::operator=((interval *)&psi_ahrs,&local_c20);
            local_c30 = -local_510.Pitch;
            interval::interval(&local_c00,&local_c30);
            local_c28 = -theta_ahrs_acc;
            interval::interval(&local_be8,&local_c28,&theta_ahrs_acc);
            operator+(&local_c00,&local_be8);
            interval::operator=((interval *)&theta_ahrs,&local_c20);
            interval::interval(&local_c00,&local_510.Roll);
            local_c30 = (double)((ulong)phi_ahrs_acc ^ (ulong)DAT_001cc0e0);
            interval::interval(&local_be8,&local_c30,&phi_ahrs_acc);
            operator+(&local_c00,&local_be8);
            interval::operator=((interval *)&phi_ahrs,&local_c20);
          }
          if (local_b80.bEnable_PD6_BS != 0) {
            if (local_510.vstatus_ship == 'V') {
              local_c00.inf = -10000.0;
              local_be8.inf = 10000.0;
              interval::interval(&local_c20,&local_c00.inf,&local_be8.inf);
              interval::operator=((interval *)&vrx_dvl,&local_c20);
              local_c00.inf = -10000.0;
              local_be8.inf = 10000.0;
              interval::interval(&local_c20,&local_c00.inf,&local_be8.inf);
              interval::operator=((interval *)&vry_dvl,&local_c20);
              local_c00.inf = -10000.0;
              local_be8.inf = 10000.0;
              interval::interval(&local_c20,&local_c00.inf,&local_be8.inf);
            }
            else {
              if (local_510.vstatus_ship != 'A') goto LAB_001b54ca;
              interval::interval(&local_c00,&local_510.vl_ship);
              local_c30 = -dvl_acc;
              interval::interval(&local_be8,&local_c30,&dvl_acc);
              operator+(&local_c00,&local_be8);
              interval::operator=((interval *)&vrx_dvl,&local_c20);
              local_c30 = -local_510.vt_ship;
              interval::interval(&local_c00,&local_c30);
              local_c28 = -dvl_acc;
              interval::interval(&local_be8,&local_c28,&dvl_acc);
              operator+(&local_c00,&local_be8);
              interval::operator=((interval *)&vry_dvl,&local_c20);
              interval::interval(&local_c00,&local_510.vn_ship);
              local_c30 = (double)((ulong)dvl_acc ^ (ulong)DAT_001cc0e0);
              interval::interval(&local_be8,&local_c30,&dvl_acc);
              operator+(&local_c00,&local_be8);
            }
            interval::operator=((interval *)&vrz_dvl,&local_c20);
          }
LAB_001b54ca:
          if ((local_b80.bEnable_PD6_BE != 0) && (local_510.vstatus_earth == 'A')) {
            sog = local_510.SOG;
            dVar10 = fmod((1.5707963267948966 - local_510.COG) - angle_env,6.283185307179586);
            local_c30 = fmod(dVar10 + 9.42477796076938,6.283185307179586);
            local_c30 = local_c30 + -3.141592653589793;
            interval::interval(&local_c00,&local_c30);
            local_c28 = -3.141592653589793;
            local_bd0 = 3.141592653589793;
            interval::interval(&local_be8,&local_c28,&local_bd0);
            operator+(&local_c00,&local_be8);
            interval::operator=((interval *)&psi_dvl,&local_c20);
          }
          if ((local_b80.bEnable_PD6_BD != 0) && (local_510.timesincelastgood < 4.0)) {
            altitude_AGL = local_510.Altitude_AGL;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        goto LAB_001b55ed;
      }
      puts("Connection to a NortekDVL lost.");
      SVar9 = local_b80.RS232Port.s;
      switch(local_b80.RS232Port.DevType) {
      case 0:
        SVar9 = (int)local_b80.RS232Port.hDev;
        goto LAB_001b526d;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_b80.RS232Port.s,2);
        close(SVar9);
      case 4:
        SVar9 = local_b80.RS232Port.s_srv;
        break;
      default:
        goto switchD_001b4e57_default;
      }
      shutdown(SVar9,2);
LAB_001b526d:
      iVar5 = close(SVar9);
      pcVar8 = "NortekDVL disconnected.";
      if (iVar5 != 0) {
switchD_001b4e57_default:
        pcVar8 = "NortekDVL disconnection failed.";
      }
      puts(pcVar8);
      local_c20.inf = (double)(long)(local_c08 / 1000);
      local_c20.sup = (double)(long)((local_c08 % 1000) * 1000000);
LAB_001b50ad:
      nanosleep((timespec *)&local_c20,(timespec *)0x0);
      local_c04 = local_c04 + 1;
      if (ExitOnErrorCount <= local_c04 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001b560a:
        bVar3 = true;
        break;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a NortekDVL.");
        SVar9 = local_b80.RS232Port.s;
        switch(local_b80.RS232Port.DevType) {
        case 0:
          SVar9 = (int)local_b80.RS232Port.hDev;
          goto LAB_001b5050;
        case 1:
        case 3:
          break;
        case 2:
          shutdown(local_b80.RS232Port.s,2);
          close(SVar9);
        case 4:
          SVar9 = local_b80.RS232Port.s_srv;
          break;
        default:
          goto switchD_001b4dfa_default;
        }
        shutdown(SVar9,2);
LAB_001b5050:
        iVar5 = close(SVar9);
        pcVar8 = "NortekDVL disconnected.";
        if (iVar5 != 0) {
switchD_001b4dfa_default:
          pcVar8 = "NortekDVL disconnection failed.";
        }
        puts(pcVar8);
      }
      bRestartNortekDVL = 0;
LAB_001b5083:
      iVar5 = ConnectNortekDVL(&local_b80,"NortekDVL0.txt");
      if (iVar5 != 0) {
        local_c20.inf = 4.94065645841247e-324;
        local_c20.sup = 0.0;
        goto LAB_001b50ad;
      }
      local_c08 = local_b80.threadperiod;
      memset(&local_510,0,0x3d8);
      if ((FILE *)local_b80.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b80.pfSaveFile);
        local_b80.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = true;
      if (local_b80.bSaveRawData == 0) {
LAB_001b55ed:
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (local_b80.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_618,"nortekdvl",10);
        }
        else {
          sprintf(local_618,"%.127s",local_b80.szCfgFilePath);
        }
        sVar6 = strlen(local_618);
        iVar5 = (int)sVar6 + 1;
        uVar7 = sVar6 & 0xffffffff;
        do {
          if ((int)uVar7 < 1) goto LAB_001b51c8;
          uVar1 = uVar7 - 1;
          iVar5 = iVar5 + -1;
          lVar4 = uVar7 - 1;
          uVar7 = uVar1;
        } while (local_618[lVar4] != '.');
        if ((uVar1 != 0) && (iVar5 <= (int)sVar6)) {
          memset(local_618 + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
        }
LAB_001b51c8:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar8 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_618,pcVar8);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_b80.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_b80.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NortekDVL data file.");
          bVar3 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_b88 == 0) {
    clock_gettime(4,(timespec *)&local_c20);
    local_bb8._8_8_ = local_c20.sup;
    local_bb8._0_8_ = local_c20.inf;
    local_c20.inf =
         (double)((((long)local_c20.inf + local_ba8._0_8_) - local_bc8.tv_sec) +
                 ((long)local_c20.sup + local_ba8._8_8_) / 1000000000);
    local_c20.sup =
         (double)(((long)local_c20.sup + local_ba8._8_8_) % 1000000000 - local_bc8.tv_nsec);
    if ((long)local_c20.sup < 0) {
      local_c20.inf = (double)((long)local_c20.inf + ~((ulong)-(long)local_c20.sup / 1000000000));
      local_c20.sup =
           (double)((long)local_c20.sup + 1000000000 +
                   ((ulong)-(long)local_c20.sup / 1000000000) * 1000000000);
    }
    local_ba8._8_8_ = local_c20.sup;
    local_ba8._0_8_ = local_c20.inf;
  }
  if ((FILE *)local_b80.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_b80.pfSaveFile);
    local_b80.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001b5776;
  switch(local_b80.RS232Port.DevType) {
  case 0:
    goto LAB_001b5756;
  case 1:
  case 3:
    SVar9 = local_b80.RS232Port.s;
    break;
  case 2:
    shutdown(local_b80.RS232Port.s,2);
    close(local_b80.RS232Port.s);
  case 4:
    SVar9 = local_b80.RS232Port.s_srv;
    break;
  default:
    goto switchD_001b571e_default;
  }
  shutdown(SVar9,2);
  local_b80.RS232Port.hDev._0_4_ = SVar9;
LAB_001b5756:
  iVar5 = close((int)local_b80.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar8 = "NortekDVL disconnected.";
  }
  else {
switchD_001b571e_default:
    pcVar8 = "NortekDVL disconnection failed.";
  }
  puts(pcVar8);
LAB_001b5776:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE NortekDVLThread(void* pParam)
{
	NORTEKDVL nortekdvl;
	NMEADATA nmeadata;
	//double vrx = 0, vry = 0, vrz = 0, alt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&nortekdvl, 0, sizeof(NORTEKDVL));

	memset(&nmeadata, 0, sizeof(nmeadata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseNortekDVL)
		{
			if (bConnected)
			{
				printf("NortekDVL paused.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNortekDVL)
		{
			if (bConnected)
			{
				printf("Restarting a NortekDVL.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
			}
			bRestartNortekDVL = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNortekDVL(&nortekdvl, "NortekDVL0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nortekdvl.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nortekdvl.pfSaveFile != NULL)
				{
					fclose(nortekdvl.pfSaveFile); 
					nortekdvl.pfSaveFile = NULL;
				}
				if ((nortekdvl.bSaveRawData)&&(nortekdvl.pfSaveFile == NULL)) 
				{
					if (strlen(nortekdvl.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nortekdvl.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nortekdvl");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nortekdvl.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nortekdvl.pfSaveFile == NULL) 
					{
						printf("Unable to create NortekDVL data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetNMEASentenceNortekDVL(&nortekdvl, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				if (nortekdvl.bEnable_PD6_SA||nortekdvl.bEnable_PD6_TS||nortekdvl.bEnable_PD6_BI||nortekdvl.bEnable_PD6_BS||
					nortekdvl.bEnable_PD6_BE||nortekdvl.bEnable_PD6_BD)
				{
					if (nortekdvl.bEnable_PD6_SA)
					{
						psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
						theta_ahrs = -nmeadata.Pitch+interval(-theta_ahrs_acc, theta_ahrs_acc);
						phi_ahrs = nmeadata.Roll+interval(-phi_ahrs_acc, phi_ahrs_acc);
					}

					if (nortekdvl.bEnable_PD6_BS)
					{
						if (nmeadata.vstatus_ship == 'A')
						{
							vrx_dvl = nmeadata.vl_ship+interval(-dvl_acc, dvl_acc);
							vry_dvl = -nmeadata.vt_ship+interval(-dvl_acc, dvl_acc);
							vrz_dvl = nmeadata.vn_ship+interval(-dvl_acc, dvl_acc);
						}
						else if (nmeadata.vstatus_ship == 'V')
						{
							vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
							vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
						}
					}

					if (nortekdvl.bEnable_PD6_BE)
					{
						if (nmeadata.vstatus_earth == 'A')
						{
							sog = nmeadata.SOG;
							psi_dvl = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
						}
					}

					if (nortekdvl.bEnable_PD6_BD)
					{
						if (nmeadata.timesincelastgood < 4) altitude_AGL = nmeadata.Altitude_AGL;
					}
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NortekDVL lost.\n");
				bConnected = FALSE;
				DisconnectNortekDVL(&nortekdvl);
				mSleep(threadperiod);
			}
		}

		//printf("NortekDVLThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (nortekdvl.pfSaveFile != NULL)
	{
		fclose(nortekdvl.pfSaveFile); 
		nortekdvl.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNortekDVL(&nortekdvl);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}